

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O0

FormulaUnit * Shell::Flattening::flatten(FormulaUnit *unit)

{
  bool bVar1;
  FormulaUnit *pFVar2;
  ostream *poVar3;
  FormulaUnit *in_RDI;
  FormulaUnit *res;
  Formula *g;
  Formula *f;
  FormulaClauseTransformation *in_stack_ffffffffffffff08;
  Options *in_stack_ffffffffffffff10;
  string *psVar4;
  string local_b8 [8];
  Inference *in_stack_ffffffffffffff50;
  Formula *in_stack_ffffffffffffff58;
  FormulaUnit *in_stack_ffffffffffffff60;
  string local_98 [35];
  undefined1 local_75;
  FormulaClauseTransformation local_68;
  Inference local_58;
  FormulaUnit *local_28;
  Formula *local_20;
  Formula *local_18;
  FormulaUnit *local_10;
  FormulaUnit *in_stack_fffffffffffffff8;
  
  local_10 = in_RDI;
  local_18 = Kernel::FormulaUnit::formula(in_RDI);
  local_20 = flatten((Formula *)in_stack_ffffffffffffff50);
  local_28 = local_10;
  if (local_18 != local_20) {
    pFVar2 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0xb979ca);
    local_75 = 1;
    Kernel::FormulaClauseTransformation::FormulaClauseTransformation
              (&local_68,FLATTEN,&local_10->super_Unit);
    Kernel::Inference::Inference((Inference *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    Kernel::FormulaUnit::FormulaUnit
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_75 = 0;
    Kernel::Inference::~Inference(&local_58);
    local_28 = pFVar2;
    bVar1 = Options::showPreprocessing(in_stack_ffffffffffffff10);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"[PP] flatten in: ");
      Kernel::FormulaUnit::toString_abi_cxx11_(in_stack_fffffffffffffff8);
      poVar3 = std::operator<<(poVar3,local_98);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_98);
      poVar3 = std::operator<<((ostream *)&std::cout,"[PP] flatten out: ");
      psVar4 = local_b8;
      Kernel::FormulaUnit::toString_abi_cxx11_(in_stack_fffffffffffffff8);
      poVar3 = std::operator<<(poVar3,psVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_b8);
    }
  }
  return local_28;
}

Assistant:

FormulaUnit* Flattening::flatten (FormulaUnit* unit)
{
  ASS(! unit->isClause());

  Formula* f = unit->formula();
  Formula* g = flatten(f);
  if (f == g) { // not changed
    return unit;
  }

  FormulaUnit* res = new FormulaUnit(g,
      FormulaClauseTransformation(InferenceRule::FLATTEN,unit));
  if (env.options->showPreprocessing()) {
    std::cout << "[PP] flatten in: " << unit->toString() << std::endl;
    std::cout << "[PP] flatten out: " << res->toString() << std::endl;
  }
  return res;
}